

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemorySizeExpr(Validator *this,MemorySizeExpr *expr)

{
  Var local_70;
  Enum local_24;
  MemorySizeExpr *local_20;
  MemorySizeExpr *expr_local;
  Validator *this_local;
  
  local_20 = expr;
  expr_local = (MemorySizeExpr *)this;
  Var::Var(&local_70,&expr->memidx);
  local_24 = (Enum)SharedValidator::OnMemorySize
                             (&this->validator_,
                              &(expr->super_ExprMixin<(wabt::ExprType)33>).super_Expr.loc,&local_70)
  ;
  Result::operator|=(&this->result_,(Result)local_24);
  Var::~Var(&local_70);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnMemorySizeExpr(MemorySizeExpr* expr) {
  result_ |= validator_.OnMemorySize(expr->loc, expr->memidx);
  return Result::Ok;
}